

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommyarrayblk.c
# Opt level: O2

void tommy_arrayblk_done(tommy_arrayblk *array)

{
  long lVar1;
  void *ptr;
  uint pos;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (pos = 0; pos < (array->block).count; pos = pos + 1) {
    ptr = tommy_array_get(&array->block,pos);
    lrtr_free(ptr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    tommy_array_done(&array->block);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void tommy_arrayblk_done(tommy_arrayblk* array)
{
	tommy_count_t i;

	for (i = 0; i < tommy_array_size(&array->block); ++i)
		tommy_free(tommy_array_get(&array->block, i));

	tommy_array_done(&array->block);
}